

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_DCtx_getParameter(ZSTD_DCtx *dctx,ZSTD_dParameter param,int *value)

{
  ZSTD_bufferMode_e ZVar1;
  
  switch(param) {
  case ZSTD_d_experimentalParam1:
    ZVar1 = dctx->format;
    break;
  case ZSTD_d_experimentalParam2:
    ZVar1 = dctx->outBufferMode;
    break;
  case ZSTD_d_experimentalParam3:
    ZVar1 = dctx->forceIgnoreChecksum;
    break;
  case ZSTD_d_experimentalParam4:
    ZVar1 = dctx->refMultipleDDicts;
    break;
  default:
    if (param != ZSTD_d_windowLogMax) {
      return 0xffffffffffffffd8;
    }
    ZVar1 = 0x1f;
    if ((int)dctx->maxWindowSize != 0) {
      for (; (uint)dctx->maxWindowSize >> ZVar1 == 0; ZVar1 = ZVar1 - ZSTD_bm_stable) {
      }
    }
  }
  *value = ZVar1;
  return 0;
}

Assistant:

size_t ZSTD_DCtx_getParameter(ZSTD_DCtx* dctx, ZSTD_dParameter param, int* value)
{
    switch (param) {
        case ZSTD_d_windowLogMax:
            *value = (int)ZSTD_highbit32((U32)dctx->maxWindowSize);
            return 0;
        case ZSTD_d_format:
            *value = (int)dctx->format;
            return 0;
        case ZSTD_d_stableOutBuffer:
            *value = (int)dctx->outBufferMode;
            return 0;
        case ZSTD_d_forceIgnoreChecksum:
            *value = (int)dctx->forceIgnoreChecksum;
            return 0;
        case ZSTD_d_refMultipleDDicts:
            *value = (int)dctx->refMultipleDDicts;
            return 0;
        default:;
    }
    RETURN_ERROR(parameter_unsupported, "");
}